

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_messaging_ll.c
# Opt level: O0

SEND_CALLBACK_DATA *
enqueue_send_callback_data
          (IOTHUB_MESSAGING_HANDLE messagingHandle,
          IOTHUB_SEND_COMPLETE_CALLBACK sendCompleteCallback,void *userContext)

{
  size_t sVar1;
  _Bool _Var2;
  LOGGER_LOG p_Var3;
  LIST_ITEM_HANDLE pLVar4;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  SEND_CALLBACK_DATA *result;
  void *userContext_local;
  IOTHUB_SEND_COMPLETE_CALLBACK sendCompleteCallback_local;
  IOTHUB_MESSAGING_HANDLE messagingHandle_local;
  
  l = (LOGGER_LOG)0x0;
  _Var2 = is_send_queue_full(messagingHandle);
  if (_Var2) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 != (LOGGER_LOG)0x0) {
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                ,"enqueue_send_callback_data",0x69,1,"Send queue is full");
    }
  }
  else {
    l = (LOGGER_LOG)malloc(0x20);
    if (l == (LOGGER_LOG)0x0) {
      p_Var3 = xlogging_get_log_function();
      if (p_Var3 != (LOGGER_LOG)0x0) {
        (*p_Var3)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                  ,"enqueue_send_callback_data",0x71,1,"Failed allocating SEND_CALLBACK_DATA");
      }
    }
    else {
      sVar1 = messagingHandle->next_send_data_id;
      messagingHandle->next_send_data_id = sVar1 + 1;
      *(size_t *)l = sVar1;
      *(IOTHUB_MESSAGING_HANDLE *)(l + 8) = messagingHandle;
      *(IOTHUB_SEND_COMPLETE_CALLBACK *)(l + 0x10) = sendCompleteCallback;
      *(void **)(l + 0x18) = userContext;
      pLVar4 = singlylinkedlist_add(messagingHandle->send_callback_data,l);
      if (pLVar4 == (LIST_ITEM_HANDLE)0x0) {
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 != (LOGGER_LOG)0x0) {
          (*p_Var3)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                    ,"enqueue_send_callback_data",0x80,1,
                    "Failed adding context to send_callback_data");
        }
        free(l);
        l = (LOGGER_LOG)0x0;
      }
      else {
        messagingHandle->send_queue_size = messagingHandle->send_queue_size + 1;
      }
    }
  }
  return (SEND_CALLBACK_DATA *)l;
}

Assistant:

static SEND_CALLBACK_DATA* enqueue_send_callback_data(IOTHUB_MESSAGING_HANDLE messagingHandle, IOTHUB_SEND_COMPLETE_CALLBACK sendCompleteCallback, void* userContext)
{
    SEND_CALLBACK_DATA* result = NULL;

    if (is_send_queue_full(messagingHandle))
    {
        LogError("Send queue is full");
    }
    else
    {
        result = malloc(sizeof(SEND_CALLBACK_DATA));

        if (result == NULL)
        {
            LogError("Failed allocating SEND_CALLBACK_DATA");
        }
        else
        {
            // There is a possible type overflow here in next_send_data_id, which could be
            // bad if another SEND_CALLBACK_DATA is already in the queue with the same id.
            // However that is extremely unlikely, since there would need to be SIZE_MAX + 1
            // items in the send_callback_data list.
            result->id = messagingHandle->next_send_data_id++;
            result->messagingHandle = messagingHandle;
            result->callback = sendCompleteCallback;
            result->userContext = userContext;

            if (singlylinkedlist_add(messagingHandle->send_callback_data, result) == NULL)
            {
                LogError("Failed adding context to send_callback_data");
                free(result);
                result = NULL;
            }
            else
            {
                messagingHandle->send_queue_size++;
            }
        }
    }

    return result;
}